

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void * parse_all_variable(Parser *parser,Modifier *modifier)

{
  List *list;
  void *data;
  List *stmt;
  void *variable;
  Modifier *modifier_local;
  Parser *parser_local;
  
  parser_local = (Parser *)parse_variable(parser,modifier);
  if (parser->token->kind == COMM) {
    list = new_list();
    list_add(list,parser_local);
    while (parser->token->kind == COMM) {
      bmove(parser);
      data = parse_variable(parser,modifier);
      list_add(list,data);
    }
    parser_local = (Parser *)new_stmt(list);
  }
  return parser_local;
}

Assistant:

void *parse_all_variable(Parser *parser, Modifier *modifier) {
    void *variable = parse_variable(parser, modifier);
    if (token(parser)->kind != COMM)
        return variable;
    List *stmt = new_list();
    list_add(stmt, variable);
    while (true) {
        if (token(parser)->kind == COMM) {
            bmove(parser);
        } else {
            break;
        }
        list_add(stmt, parse_variable(parser, modifier));
    }
    return new_stmt(stmt);
}